

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * create_swizzle_abi_cxx11_(MSLComponentSwizzle swizzle)

{
  CompilerError *this;
  undefined4 in_ESI;
  undefined4 in_register_0000003c;
  string *this_00;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [5];
  string *psStack_10;
  MSLComponentSwizzle swizzle_local;
  
  this_00 = (string *)CONCAT44(in_register_0000003c,swizzle);
  psStack_10 = this_00;
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"spvSwizzle::none",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"spvSwizzle::zero",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"spvSwizzle::one",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"spvSwizzle::red",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"spvSwizzle::green",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"spvSwizzle::blue",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"spvSwizzle::alpha",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  default:
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Invalid component swizzle.");
    __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,
                spirv_cross::CompilerError::~CompilerError);
  }
  return this_00;
}

Assistant:

static string create_swizzle(MSLComponentSwizzle swizzle)
{
	switch (swizzle)
	{
	case MSL_COMPONENT_SWIZZLE_IDENTITY:
		return "spvSwizzle::none";
	case MSL_COMPONENT_SWIZZLE_ZERO:
		return "spvSwizzle::zero";
	case MSL_COMPONENT_SWIZZLE_ONE:
		return "spvSwizzle::one";
	case MSL_COMPONENT_SWIZZLE_R:
		return "spvSwizzle::red";
	case MSL_COMPONENT_SWIZZLE_G:
		return "spvSwizzle::green";
	case MSL_COMPONENT_SWIZZLE_B:
		return "spvSwizzle::blue";
	case MSL_COMPONENT_SWIZZLE_A:
		return "spvSwizzle::alpha";
	default:
		SPIRV_CROSS_THROW("Invalid component swizzle.");
	}
}